

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_intarith(ASMState *as,IRIns *ir,x86Arith xa)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  byte *pbVar4;
  MCode *pMVar5;
  uint uVar6;
  Reg dest;
  int iVar7;
  Reg RVar8;
  uint uVar9;
  byte bVar10;
  long *plVar11;
  uint uVar12;
  uint uVar13;
  x86Op xVar14;
  bool bVar15;
  IRRef local_3c;
  
  uVar1 = (ir->field_0).op1;
  local_3c = (IRRef)uVar1;
  uVar2 = (ir->field_0).op2;
  pbVar4 = as->mcp;
  if (as->flagmcp == pbVar4) {
    bVar15 = *pbVar4 < 0x84;
    bVar10 = pbVar4[(ulong)bVar15 + 3] & 0xf;
    if (bVar10 < 0xe) {
      if (0xb < bVar10) {
        pbVar4[(ulong)bVar15 + 3] = pbVar4[(ulong)bVar15 + 3] - 4;
      }
      as->flagmcp = (MCode *)0x0;
      as->mcp = pbVar4 + (ulong)bVar15 + 2;
    }
  }
  bVar10 = *(byte *)((long)as->ir + (ulong)uVar2 * 8 + 6);
  if ((char)bVar10 < '\0') {
    uVar13 = 0xffef;
  }
  else {
    uVar13 = ~(1 << (bVar10 & 0x1f)) & 0xffef;
    as->weakset = as->weakset & (-2 << (bVar10 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar10 & 0x1f));
  }
  dest = ra_dest(as,ir,uVar13);
  uVar9 = 0;
  RVar8 = dest;
  if ((uVar1 != uVar2) && (RVar8 = (uint)bVar10, (char)bVar10 < '\0')) {
    uVar12 = (uint)uVar2;
    if ((short)uVar2 < 0) {
      bVar15 = true;
      uVar9 = 0;
    }
    else {
      bVar15 = false;
      uVar9 = as->ir[uVar12].i;
      plVar11 = (long *)(ulong)uVar9;
      if (*(char *)((long)as->ir + (ulong)uVar12 * 8 + 5) == '\x1c') {
        uVar9 = (uint)*plVar11;
        bVar15 = (long)(int)uVar9 != *plVar11;
        if (bVar15) {
          uVar9 = 0;
        }
      }
    }
    RVar8 = (uint)bVar10;
    if (bVar15) {
      iVar7 = asm_swapops(as,ir);
      uVar6 = uVar12;
      if (iVar7 == 0) {
        uVar6 = local_3c;
        local_3c = uVar12;
      }
      uVar12._0_2_ = *(IROpT *)((long)ir + 4);
      uVar12._2_2_ = *(IRRef1 *)((long)ir + 6);
      RVar8 = asm_fuseloadm(as,local_3c,uVar13 & ~(1 << (dest & 0x1f)),
                            (uint)((0x604208U >> (uVar12 & 0x1f) & 1) != 0));
      local_3c = uVar6;
    }
  }
  if ((char)(ir->field_1).t.irt < '\0') {
    asm_guardcc(as,0);
  }
  if (xa == XOg_X_IMUL) {
    uVar6._0_2_ = *(IROpT *)((long)ir + 4);
    uVar6._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar12 = (uint)((0x604208U >> (uVar6 & 0x1f) & 1) != 0);
    if (0x7f < RVar8) {
      RVar8 = asm_fuseloadm(as,local_3c,0xffef,uVar12);
      if ((int)(char)(MCode)uVar9 == uVar9) {
        pMVar5 = as->mcp;
        as->mcp = pMVar5 + -1;
        pMVar5[-1] = (MCode)uVar9;
        xVar14 = XO_IMULi8;
      }
      else {
        pMVar5 = as->mcp;
        *(uint *)(pMVar5 + -4) = uVar9;
        as->mcp = pMVar5 + -4;
        xVar14 = XO_IMULi;
      }
      uVar3._0_2_ = *(IROpT *)((long)ir + 4);
      uVar3._2_2_ = *(IRRef1 *)((long)ir + 6);
      emit_mrm(as,xVar14,-(uint)((0x604208U >> (uVar3 & 0x1f) & 1) != 0) & 0x80200 | dest,RVar8);
      return;
    }
    uVar13 = 0x80200;
    if (uVar12 == 0) {
      uVar13 = 0;
    }
    xVar14 = XO_IMUL;
  }
  else {
    if (0x7f < RVar8) {
      uVar13._0_2_ = *(IROpT *)((long)ir + 4);
      uVar13._2_2_ = *(IRRef1 *)((long)ir + 6);
      emit_gri(as,xa + 0x838100,-(uint)((0x604208U >> (uVar13 & 0x1f) & 1) != 0) & 0x80200 | dest,
               uVar9);
      goto LAB_0013e062;
    }
    xVar14 = xa << 0x1b | 0x30000fe;
    uVar9._0_2_ = *(IROpT *)((long)ir + 4);
    uVar9._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar13 = -(uint)((0x604208U >> (uVar9 & 0x1f) & 1) != 0) & 0x80200;
  }
  emit_mrm(as,xVar14,uVar13 | dest,RVar8);
LAB_0013e062:
  ra_left(as,dest,local_3c);
  return;
}

Assistant:

static void asm_intarith(ASMState *as, IRIns *ir, x86Arith xa)
{
  IRRef lref = ir->op1;
  IRRef rref = ir->op2;
  RegSet allow = RSET_GPR;
  Reg dest, right;
  int32_t k = 0;
  if (as->flagmcp == as->mcp) {  /* Drop test r,r instruction. */
    MCode *p = as->mcp + ((LJ_64 && *as->mcp < XI_TESTb) ? 3 : 2);
    if ((p[1] & 15) < 14) {
      if ((p[1] & 15) >= 12) p[1] -= 4;  /* L <->S, NL <-> NS */
      as->flagmcp = NULL;
      as->mcp = p;
    }  /* else: cannot transform LE/NLE to cc without use of OF. */
  }
  right = IR(rref)->r;
  if (ra_hasreg(right)) {
    rset_clear(allow, right);
    ra_noweak(as, right);
  }
  dest = ra_dest(as, ir, allow);
  if (lref == rref) {
    right = dest;
  } else if (ra_noreg(right) && !asm_isk32(as, rref, &k)) {
    if (asm_swapops(as, ir)) {
      IRRef tmp = lref; lref = rref; rref = tmp;
    }
    right = asm_fuseloadm(as, rref, rset_clear(allow, dest), irt_is64(ir->t));
  }
  if (irt_isguard(ir->t))  /* For IR_ADDOV etc. */
    asm_guardcc(as, CC_O);
  if (xa != XOg_X_IMUL) {
    if (ra_hasreg(right))
      emit_mrm(as, XO_ARITH(xa), REX_64IR(ir, dest), right);
    else
      emit_gri(as, XG_ARITHi(xa), REX_64IR(ir, dest), k);
  } else if (ra_hasreg(right)) {  /* IMUL r, mrm. */
    emit_mrm(as, XO_IMUL, REX_64IR(ir, dest), right);
  } else {  /* IMUL r, r, k. */
    /* NYI: use lea/shl/add/sub (FOLD only does 2^k) depending on CPU. */
    Reg left = asm_fuseloadm(as, lref, RSET_GPR, irt_is64(ir->t));
    x86Op xo;
    if (checki8(k)) { emit_i8(as, k); xo = XO_IMULi8;
    } else { emit_i32(as, k); xo = XO_IMULi; }
    emit_mrm(as, xo, REX_64IR(ir, dest), left);
    return;
  }
  ra_left(as, dest, lref);
}